

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::ExcludesError::~ExcludesError(ExcludesError *this)

{
  void *in_RDI;
  
  ~ExcludesError((ExcludesError *)0x1e7658);
  operator_delete(in_RDI,0x38);
  return;
}

Assistant:

ExcludesError(std::string curname, std::string subname)
        : ExcludesError(curname + " excludes " + subname, ExitCodes::ExcludesError) {}